

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_file_scanner.cpp
# Opt level: O2

void __thiscall duckdb::CSVFileScan::InitializeFileNamesTypes(CSVFileScan *this)

{
  MultiFileLocalColumnIds<duckdb::MultiFileLocalColumnId> *this_00;
  size_type __n;
  pointer ppVar1;
  pointer pMVar2;
  reference pvVar3;
  reference pvVar4;
  iterator iVar5;
  pointer pMVar6;
  vector<duckdb::LogicalType,_true> *this_01;
  idx_t i;
  pointer __n_00;
  ulong uVar7;
  long lVar8;
  undefined8 local_60;
  vector<duckdb::LogicalType,_true> sorted_types;
  
  pMVar2 = (this->super_BaseFileReader).column_ids.column_ids.
           super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
           .
           super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar6 = *(pointer *)
            ((long)&(this->super_BaseFileReader).column_ids.column_ids.
                    super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                    .
                    super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                    ._M_impl.super__Vector_impl_data + 8);
  this_01 = &this->file_types;
  if (pMVar2 == pMVar6) {
    ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
    emplace_back<duckdb::LogicalTypeId_const&>
              ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)this_01,
               &LogicalType::VARCHAR);
    sorted_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ::std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::_M_insert_unique<unsigned_long>
              (&(this->projected_columns)._M_t,(unsigned_long *)&sorted_types);
    sorted_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)sorted_types.
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    local_60 = (ulong)local_60._4_4_ << 0x20;
    ::std::
    vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
    ::emplace_back<int,int>
              ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                *)&this->projection_ids,(int *)&sorted_types,(int *)&local_60);
  }
  else {
    this_00 = &(this->super_BaseFileReader).column_ids;
    for (__n_00 = (pointer)0x0; __n_00 < (pointer)((long)pMVar6 - (long)pMVar2 >> 3);
        __n_00 = (pointer)&__n_00->physical_type_) {
      sorted_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start = __n_00;
      pvVar3 = vector<duckdb::MultiFileLocalColumnId,_true>::get<true>
                         (&this_00->column_ids,(size_type)__n_00);
      __n = pvVar3->column_id;
      pvVar4 = vector<duckdb::LogicalType,_true>::get<true>(&this->types,__n);
      ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
      emplace_back<duckdb::LogicalType&>
                ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)this_01,pvVar4);
      local_60 = __n;
      ::std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::_M_insert_unique<unsigned_long>(&(this->projected_columns)._M_t,&local_60);
      local_60 = __n;
      ::std::
      vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
      ::emplace_back<unsigned_long,duckdb::MultiFileLocalIndex&>
                ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                  *)&this->projection_ids,&local_60,(MultiFileLocalIndex *)&sorted_types);
      pMVar2 = (this->super_BaseFileReader).column_ids.column_ids.
               super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
               .
               super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pMVar6 = *(pointer *)
                ((long)&(this->super_BaseFileReader).column_ids.column_ids.
                        super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                        .
                        super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                        ._M_impl.super__Vector_impl_data + 8);
    }
    if (pMVar2 == pMVar6) {
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
                (&this_01->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 &(this->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    }
    if ((this->super_BaseFileReader).cast_map._M_h._M_element_count != 0) {
      for (uVar7 = 0;
          uVar7 < (ulong)((long)*(pointer *)
                                 ((long)&(this->super_BaseFileReader).column_ids.column_ids.
                                         super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                         .
                                         super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                         ._M_impl.super__Vector_impl_data + 8) -
                          (long)(this->super_BaseFileReader).column_ids.column_ids.
                                super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                .
                                super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3); uVar7 = uVar7 + 1)
      {
        pvVar3 = vector<duckdb::MultiFileLocalColumnId,_true>::get<true>(&this_00->column_ids,uVar7)
        ;
        sorted_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)pvVar3->column_id;
        iVar5 = ::std::
                _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::LogicalType>,_std::allocator<std::pair<const_unsigned_long,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(this->super_BaseFileReader).cast_map._M_h,(key_type *)&sorted_types);
        if (iVar5.
            super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::LogicalType>,_false>.
            _M_cur != (__node_type *)0x0) {
          pvVar4 = vector<duckdb::LogicalType,_true>::get<true>(this_01,uVar7);
          LogicalType::operator=
                    (pvVar4,(LogicalType *)
                            ((long)iVar5.
                                   super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::LogicalType>,_false>
                                   ._M_cur + 0x10));
        }
      }
    }
    ::std::
    __sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,unsigned_long>*,std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ((this->projection_ids).
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (this->projection_ids).
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    sorted_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    sorted_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    sorted_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar8 = 8;
    for (uVar7 = 0;
        ppVar1 = (this->projection_ids).
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar7 < (ulong)((long)(this->projection_ids).
                              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4);
        uVar7 = uVar7 + 1) {
      pvVar4 = vector<duckdb::LogicalType,_true>::get<true>
                         (this_01,*(size_type *)((long)&ppVar1->first + lVar8));
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&sorted_types.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,pvVar4);
      lVar8 = lVar8 + 0x10;
    }
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
              (&this_01->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               &sorted_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
              );
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              (&sorted_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
              );
  }
  return;
}

Assistant:

void CSVFileScan::InitializeFileNamesTypes() {
	if (column_ids.empty()) {
		// This means that the columns from this file are irrelevant.
		// just read the first column
		file_types.emplace_back(LogicalType::VARCHAR);
		projected_columns.insert(0);
		projection_ids.emplace_back(0, 0);
		return;
	}

	for (idx_t i = 0; i < column_ids.size(); i++) {
		auto col_idx = MultiFileLocalIndex(i);
		auto column_id = column_ids[col_idx];
		file_types.emplace_back(types[column_id.GetId()]);
		projected_columns.insert(column_id.GetId());
		projection_ids.emplace_back(column_id.GetId(), col_idx);
	}

	if (column_ids.empty()) {
		file_types = types;
	}

	// We need to be sure that our types are also following the cast_map
	if (!cast_map.empty()) {
		for (idx_t i = 0; i < column_ids.size(); i++) {
			auto local_idx = MultiFileLocalIndex(i);
			auto entry = cast_map.find(column_ids[local_idx].GetId());
			if (entry != cast_map.end()) {
				file_types[i] = entry->second;
			}
		}
	}

	// We sort the types on the order of the parsed chunk
	std::sort(projection_ids.begin(), projection_ids.end());
	vector<LogicalType> sorted_types;
	for (idx_t i = 0; i < projection_ids.size(); ++i) {
		sorted_types.push_back(file_types[projection_ids[i].second]);
	}
	file_types = sorted_types;
}